

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams.cpp
# Opt level: O0

size_t __thiscall AutoFile::detail_fread(AutoFile *this,Span<std::byte> dst)

{
  long lVar1;
  Span<const_std::byte> key;
  bool bVar2;
  char *pcVar3;
  byte *pbVar4;
  size_t __n;
  size_t sVar5;
  long *plVar6;
  byte *in_RDI;
  long in_FS_OFFSET;
  Span<std::byte> SVar7;
  size_t ret;
  Span<std::byte> *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  io_errc in_stack_ffffffffffffff34;
  error_code *in_stack_ffffffffffffff38;
  size_t in_stack_ffffffffffffff40;
  size_t sVar8;
  Span<std::byte> *in_stack_ffffffffffffff48;
  size_t in_stack_ffffffffffffff50;
  char *pcVar9;
  byte *in_stack_ffffffffffffff70;
  size_t in_stack_ffffffffffffff78;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(undefined8 *)in_RDI == 0) {
    pcVar3 = (char *)__cxa_allocate_exception(0x20);
    pcVar9 = pcVar3;
    std::error_code::error_code<std::io_errc,void>
              (in_stack_ffffffffffffff38,in_stack_ffffffffffffff34);
    std::ios_base::failure[abi:cxx11]::failure
              (pcVar9,(error_code *)"AutoFile::read: file handle is nullptr");
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(pcVar3,&std::ios_base::failure[abi:cxx11]::typeinfo,
                  std::ios_base::failure[abi:cxx11]::~failure);
    }
  }
  else {
    pbVar4 = Span<std::byte>::data(in_stack_ffffffffffffff28);
    __n = Span<std::byte>::size(in_stack_ffffffffffffff28);
    sVar5 = fread(pbVar4,1,__n,*(FILE **)in_RDI);
    bVar2 = std::vector<std::byte,_std::allocator<std::byte>_>::empty
                      ((vector<std::byte,_std::allocator<std::byte>_> *)in_stack_ffffffffffffff38);
    if (!bVar2) {
      bVar2 = std::optional<long>::has_value((optional<long> *)in_stack_ffffffffffffff28);
      if (!bVar2) {
        pcVar3 = (char *)__cxa_allocate_exception(0x20);
        pcVar9 = pcVar3;
        std::error_code::error_code<std::io_errc,void>
                  (in_stack_ffffffffffffff38,in_stack_ffffffffffffff34);
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar9,(error_code *)"AutoFile::read: position unknown");
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          __cxa_throw(pcVar3,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
        goto LAB_00ffd882;
      }
      SVar7 = Span<std::byte>::subspan
                        (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                         (size_t)in_stack_ffffffffffffff38);
      pbVar4 = SVar7.m_data;
      Span<std::byte_const>::Span<std::vector<std::byte,std::allocator<std::byte>>>
                ((Span<const_std::byte> *)in_stack_ffffffffffffff38,
                 (vector<std::byte,_std::allocator<std::byte>_> *)
                 CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                 in_stack_ffffffffffffff28);
      std::optional<long>::operator*((optional<long> *)in_stack_ffffffffffffff28);
      SVar7.m_size = (size_t)pbVar4;
      SVar7.m_data = in_RDI;
      key.m_size = in_stack_ffffffffffffff78;
      key.m_data = in_stack_ffffffffffffff70;
      util::Xor(SVar7,key,in_stack_ffffffffffffff50);
    }
    bVar2 = std::optional<long>::has_value((optional<long> *)in_stack_ffffffffffffff28);
    if (bVar2) {
      sVar8 = sVar5;
      plVar6 = std::optional<long>::operator*((optional<long> *)in_stack_ffffffffffffff28);
      *plVar6 = sVar8 + *plVar6;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return sVar5;
    }
  }
LAB_00ffd882:
  __stack_chk_fail();
}

Assistant:

std::size_t AutoFile::detail_fread(Span<std::byte> dst)
{
    if (!m_file) throw std::ios_base::failure("AutoFile::read: file handle is nullptr");
    size_t ret = std::fread(dst.data(), 1, dst.size(), m_file);
    if (!m_xor.empty()) {
        if (!m_position.has_value()) throw std::ios_base::failure("AutoFile::read: position unknown");
        util::Xor(dst.subspan(0, ret), m_xor, *m_position);
    }
    if (m_position.has_value()) *m_position += ret;
    return ret;
}